

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_ray_hit_info *
rf_collision_ray_triangle
          (rf_ray_hit_info *__return_storage_ptr__,rf_ray ray,rf_vec3 p1,rf_vec3 p2,rf_vec3 p3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  rf_vec3 rVar8;
  rf_vec3 v1;
  rf_vec3 v1_00;
  rf_vec3 v2;
  rf_vec3 v2_00;
  float local_28;
  float fStack_24;
  
  fVar7 = p1.z;
  fVar2 = p1.x;
  fVar3 = p1.y;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->normal).y = 0.0;
  (__return_storage_ptr__->normal).z = 0.0;
  __return_storage_ptr__->hit = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->distance = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  v2.x = p2.x - fVar2;
  v2.y = p2.y - fVar3;
  v2.z = p2.z - fVar7;
  fVar4 = p3.x - fVar2;
  fVar5 = p3.y - fVar3;
  fVar6 = p3.z - fVar7;
  rVar8.y = fVar5;
  rVar8.x = fVar4;
  rVar8.z = fVar6;
  rVar8 = rf_vec3_cross_product(ray.direction,rVar8);
  fVar1 = v2.z * rVar8.z + v2.x * rVar8.x + v2.y * rVar8.y;
  if (1e-06 <= ABS(fVar1)) {
    fVar1 = 1.0 / fVar1;
    fVar2 = ray.position.x - fVar2;
    fVar3 = ray.position.y - fVar3;
    v1.z = ray.position.z - fVar7;
    fVar7 = (rVar8.z * v1.z + fVar2 * rVar8.x + rVar8.y * fVar3) * fVar1;
    if ((0.0 <= fVar7) && (fVar7 <= 1.0)) {
      v1.y = fVar3;
      v1.x = fVar2;
      rVar8 = rf_vec3_cross_product(v1,v2);
      local_28 = ray.direction.x;
      fStack_24 = ray.direction.y;
      fVar2 = (ray.direction.z * rVar8.z + local_28 * rVar8.x + fStack_24 * rVar8.y) * fVar1;
      if ((0.0 <= fVar2) &&
         ((fVar7 + fVar2 <= 1.0 &&
          (fVar1 = fVar1 * (rVar8.z * fVar6 + rVar8.x * fVar4 + rVar8.y * fVar5), 1e-06 < fVar1))))
      {
        __return_storage_ptr__->distance = fVar1;
        __return_storage_ptr__->hit = true;
        v1_00.y = v2.y;
        v1_00.x = v2.x;
        v2_00.y = fVar5;
        v2_00.x = fVar4;
        v1_00.z = v2.z;
        v2_00.z = fVar6;
        rVar8 = rf_vec3_cross_product(v1_00,v2_00);
        rVar8 = rf_vec3_normalize(rVar8);
        (__return_storage_ptr__->normal).x = (float)(int)rVar8._0_8_;
        (__return_storage_ptr__->normal).y = (float)(int)((ulong)rVar8._0_8_ >> 0x20);
        (__return_storage_ptr__->normal).z = rVar8.z;
        (__return_storage_ptr__->position).x = ray.position.x + local_28 * fVar1;
        (__return_storage_ptr__->position).y = ray.position.y + fStack_24 * fVar1;
        (__return_storage_ptr__->position).z = ray.position.z + ray.direction.z * fVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_triangle(rf_ray ray, rf_vec3 p1, rf_vec3 p2, rf_vec3 p3)
{
#define rf_epsilon 0.000001 // Just a small number

    rf_vec3 edge1, edge2;
    rf_vec3 p, q, tv;
    float det, inv_det, u, v, t;
    rf_ray_hit_info result = {0};

// Find vectors for two edges sharing V1
    edge1 = rf_vec3_sub(p2, p1);
    edge2 = rf_vec3_sub(p3, p1);

// Begin calculating determinant - also used to calculate u parameter
    p = rf_vec3_cross_product(ray.direction, edge2);

// If determinant is near zero, ray lies in plane of triangle or ray is parallel to plane of triangle
    det = rf_vec3_dot_product(edge1, p);

// Avoid culling!
    if ((det > -rf_epsilon) && (det < rf_epsilon)) return result;

    inv_det = 1.0f / det;

// Calculate distance from V1 to ray origin
    tv = rf_vec3_sub(ray.position, p1);

// Calculate u parameter and test bound
    u = rf_vec3_dot_product(tv, p) * inv_det;

// The intersection lies outside of the triangle
    if ((u < 0.0f) || (u > 1.0f)) return result;

// Prepare to test v parameter
    q = rf_vec3_cross_product(tv, edge1);

// Calculate V parameter and test bound
    v = rf_vec3_dot_product(ray.direction, q) * inv_det;

// The intersection lies outside of the triangle
    if ((v < 0.0f) || ((u + v) > 1.0f)) return result;

    t = rf_vec3_dot_product(edge2, q) * inv_det;

    if (t > rf_epsilon)
    {
// rf_ray hit, get hit point and normal
        result.hit = true;
        result.distance = t;
        result.hit = true;
        result.normal = rf_vec3_normalize(rf_vec3_cross_product(edge1, edge2));
        result.position = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, t));
    }

    return result;
}